

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O3

void __thiscall
BRTS<TTA>::FindRuns(BRTS<TTA> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong *puVar12;
  ulong uVar13;
  unsigned_short uVar14;
  Run *pRVar15;
  ulong uVar16;
  Run *pRVar17;
  short sVar18;
  Run *pRVar19;
  ulong *puVar20;
  ulong uVar21;
  unsigned_short uVar22;
  Run *pRVar23;
  long lVar24;
  
  puVar8 = TTA::tail_;
  puVar7 = TTA::next_;
  puVar6 = TTA::rtable_;
  lVar11 = (long)data_width;
  uVar21 = *bits_start;
  sVar18 = 0;
  puVar20 = bits_start;
  pRVar17 = runs;
  while( true ) {
    for (; uVar21 != 0; uVar21 = (~uVar21 >> ((byte)lVar3 & 0x3f)) << ((byte)lVar3 & 0x3f)) {
      lVar3 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      pRVar17->start_pos = (short)lVar3 + sVar18;
      uVar21 = (~uVar21 >> ((byte)lVar3 & 0x3f)) << ((byte)lVar3 & 0x3f);
      if (uVar21 == 0) {
        do {
          sVar18 = sVar18 + 0x40;
          puVar12 = puVar20 + 1;
          puVar20 = puVar20 + 1;
        } while (*puVar12 == 0xffffffffffffffff);
        uVar21 = ~*puVar12;
      }
      lVar3 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      pRVar17->end_pos = (short)lVar3 + sVar18;
      uVar16 = (ulong)TTA::length_;
      puVar6[uVar16] = TTA::length_;
      puVar7[uVar16] = 0xffffffff;
      puVar8[TTA::length_] = TTA::length_;
      uVar10 = TTA::length_ + 1;
      pRVar17->label = TTA::length_;
      TTA::length_ = uVar10;
      pRVar17 = pRVar17 + 1;
    }
    puVar20 = puVar20 + 1;
    if (puVar20 == bits_start + lVar11) break;
    sVar18 = sVar18 + 0x40;
    uVar21 = *puVar20;
  }
  pRVar17->start_pos = 0xffff;
  pRVar17->end_pos = 0xffff;
  if (1 < height) {
    uVar21 = 1;
    do {
      pRVar15 = pRVar17 + 1;
      puVar20 = bits_start + uVar21 * lVar11;
      puVar12 = puVar20 + lVar11;
      uVar16 = *puVar20;
      lVar3 = 0;
      pRVar17 = pRVar15;
      while( true ) {
        for (; uVar16 != 0; uVar16 = ~uVar16 & -1L << ((byte)lVar5 & 0x3f)) {
          lVar4 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar16 = (~uVar16 >> ((byte)lVar4 & 0x3f)) << ((byte)lVar4 & 0x3f);
          lVar24 = lVar3;
          if (uVar16 == 0) {
            do {
              lVar24 = lVar24 + 0x40;
              puVar1 = puVar20 + 1;
              puVar20 = puVar20 + 1;
            } while (*puVar1 == 0xffffffffffffffff);
            uVar16 = ~*puVar1;
          }
          lVar5 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar22 = (unsigned_short)(lVar3 + lVar4);
          pRVar23 = runs + -1;
          do {
            pRVar19 = pRVar23;
            runs = runs + 1;
            uVar2 = pRVar19[1].end_pos;
            pRVar23 = pRVar19 + 1;
          } while ((uint)uVar2 < ((uint)(lVar3 + lVar4) & 0xffff));
          uVar14 = (unsigned_short)(lVar5 + lVar24);
          uVar10 = (uint)(lVar5 + lVar24) & 0xffff;
          if (uVar10 < pRVar23->start_pos) {
            pRVar17->start_pos = uVar22;
            pRVar17->end_pos = uVar14;
            uVar13 = (ulong)TTA::length_;
            TTA::rtable_[uVar13] = TTA::length_;
            TTA::next_[uVar13] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar9 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
          }
          else {
            uVar9 = TTA::rtable_[pRVar19[1].label];
            while ((pRVar19 = runs, uVar2 < uVar10 &&
                   (pRVar23 = pRVar19, pRVar19->start_pos <= uVar10))) {
              if (uVar9 != TTA::rtable_[pRVar19->label]) {
                uVar9 = TTA::Merge(uVar9,TTA::rtable_[pRVar19->label]);
              }
              uVar2 = pRVar19->end_pos;
              runs = pRVar19 + 1;
            }
            pRVar17->start_pos = uVar22;
            pRVar17->end_pos = uVar14;
          }
          pRVar17->label = uVar9;
          pRVar17 = pRVar17 + 1;
          lVar3 = lVar24;
          runs = pRVar23;
        }
        puVar20 = puVar20 + 1;
        if (puVar20 == puVar12) break;
        uVar16 = *puVar20;
        lVar3 = lVar3 + 0x40;
      }
      pRVar17->start_pos = 0xffff;
      pRVar17->end_pos = 0xffff;
      uVar21 = uVar21 + 1;
      runs = pRVar15;
    } while (uVar21 != (uint)height);
  }
  puVar6 = TTA::rtable_;
  uVar10 = 1;
  if (1 < TTA::length_) {
    uVar21 = 1;
    do {
      if (uVar21 == puVar6[uVar21]) {
        uVar10 = uVar10 + 1;
        uVar9 = uVar10;
      }
      else {
        uVar9 = puVar6[puVar6[uVar21]];
      }
      puVar6[uVar21] = uVar9;
      uVar21 = uVar21 + 1;
    } while (uVar21 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  return;
}

Assistant:

void FindRuns(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);

            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::GetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::Merge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }